

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextDiagnosticClient.cpp
# Opt level: O0

void __thiscall
slang::SourceSnippet::SourceSnippet(SourceSnippet *this,string_view sourceLine,uint32_t tabStop)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  size_type sVar4;
  reference piVar5;
  pointer pcVar6;
  string_view sourceLine_00;
  size_t *in_stack_fffffffffffffe78;
  size_t sVar7;
  allocator<char> local_e9;
  string local_e8 [32];
  size_type local_c8;
  unsigned_long local_c0;
  pair<unsigned_long,_unsigned_long> local_b8;
  SourceSnippet *local_a8;
  size_t sStack_a0;
  undefined1 local_98 [8];
  size_t columnWidth;
  size_t i;
  size_t column;
  SmallVector<char,_40UL> buffer;
  size_t i_1;
  uint32_t tabStop_local;
  SourceSnippet *this_local;
  string_view sourceLine_local;
  
  sourceLine_local._M_len = (size_t)sourceLine._M_str;
  this_local = (SourceSnippet *)sourceLine._M_len;
  SmallVector<int,_10UL>::SmallVector(&this->byteToColumn);
  SmallVector<std::pair<unsigned_long,_unsigned_long>,_4UL>::SmallVector(&this->invalidRanges);
  std::__cxx11::string::string((string *)&this->snippetLine);
  std::__cxx11::string::string((string *)&this->highlightLine);
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (!bVar3) {
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    SmallVectorBase<int>::resize((SmallVectorBase<int> *)this,sVar4 + 1);
    buffer._56_8_ = 0;
    while( true ) {
      uVar2 = buffer._56_8_;
      sVar4 = SmallVectorBase<int>::size((SmallVectorBase<int> *)this);
      if (sVar4 <= (ulong)uVar2) break;
      piVar5 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)this,buffer._56_8_);
      *piVar5 = -1;
      buffer._56_8_ = buffer._56_8_ + 1;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::size
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    std::__cxx11::string::reserve((ulong)&this->snippetLine);
    SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)&column);
    i = 0;
    columnWidth = 0;
    while( true ) {
      sVar7 = columnWidth;
      sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                        ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
      iVar1 = (int)i;
      if (sVar4 <= sVar7) break;
      piVar5 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)this,columnWidth);
      *piVar5 = iVar1;
      SmallVectorBase<char>::clear((SmallVectorBase<char> *)&column);
      local_a8 = this_local;
      sStack_a0 = sourceLine_local._M_len;
      sourceLine_00._M_str = (char *)&columnWidth;
      sourceLine_00._M_len = sourceLine_local._M_len;
      bVar3 = printableTextForNextChar
                        ((slang *)this_local,sourceLine_00,(size_t *)(ulong)tabStop,
                         (uint32_t)(SmallVectorBase<char> *)&column,
                         (SmallVectorBase<char> *)local_98,in_stack_fffffffffffffe78);
      if (!bVar3) {
        local_c0 = std::__cxx11::string::size();
        local_c8 = SmallVectorBase<char>::size((SmallVectorBase<char> *)&column);
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
                  (&local_b8,&local_c0,&local_c8);
        SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>::push_back
                  (&(this->invalidRanges).
                    super_SmallVectorBase<std::pair<unsigned_long,_unsigned_long>_>,&local_b8);
      }
      pcVar6 = SmallVectorBase<char>::data((SmallVectorBase<char> *)&column);
      SmallVectorBase<char>::size((SmallVectorBase<char> *)&column);
      std::__cxx11::string::append((char *)&this->snippetLine,(ulong)pcVar6);
      i = (long)local_98 + i;
    }
    sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    piVar5 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)this,sVar4);
    *piVar5 = iVar1;
    sVar7 = i;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_e8,sVar7,' ',&local_e9);
    std::__cxx11::string::operator=((string *)&this->highlightLine,local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)&column);
    return;
  }
  assert::assertFailed
            ("!sourceLine.empty()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/diagnostics/TextDiagnosticClient.cpp"
             ,0xbc,"slang::SourceSnippet::SourceSnippet(string_view, uint32_t)");
}

Assistant:

SourceSnippet(string_view sourceLine, uint32_t tabStop) {
        ASSERT(!sourceLine.empty());

        byteToColumn.resize(sourceLine.size() + 1);
        for (size_t i = 0; i < byteToColumn.size(); i++)
            byteToColumn[i] = -1;

        snippetLine.reserve(sourceLine.size());

        SmallVector<char> buffer;
        size_t column = 0;
        size_t i = 0;
        while (i < sourceLine.size()) {
            byteToColumn[i] = (int)column;

            size_t columnWidth;
            buffer.clear();
            if (!printableTextForNextChar(sourceLine, i, tabStop, buffer, columnWidth))
                invalidRanges.push_back({snippetLine.size(), buffer.size()});

            snippetLine.append(buffer.data(), buffer.size());
            column += columnWidth;
        }

        byteToColumn[sourceLine.size()] = (int)column;
        highlightLine = std::string(column, ' ');
    }